

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  long in_FS_OFFSET;
  
  if (j->spec_end != 0) {
    *(char **)(in_FS_OFFSET + -8) = "can\'t merge dc and ac";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    iVar2 = stbi__jpeg_get_bit(j);
    if (iVar2 == 0) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  uVar3 = stbi__jpeg_huff_decode(j,hdc);
  if (uVar3 < 0x10) {
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = stbi__extend_receive(j,uVar3);
    }
    uVar6 = j->img_comp[b].dc_pred;
    if (-1 < (int)(uVar6 ^ uVar3)) {
      bVar1 = (int)(uVar3 ^ 0x7fffffff) < (int)uVar6;
      if ((int)(uVar6 & uVar3) < 0) {
        bVar1 = (int)uVar6 < (int)(-0x80000000 - uVar3);
      }
      if (bVar1) {
        pcVar4 = "bad delta";
        goto LAB_001384eb;
      }
    }
    uVar6 = uVar6 + uVar3;
    j->img_comp[b].dc_pred = uVar6;
    bVar5 = (byte)j->succ_low;
    if ((int)(1 << (bVar5 & 0x1f) ^ uVar6) < 0) {
      if (j->succ_low == 0x1f) {
        if ((int)uVar6 < 1) {
LAB_001385ac:
          *data = (short)(uVar6 << (bVar5 & 0x1f));
          return 1;
        }
      }
      else {
        uVar3 = 0x8000 >> (bVar5 & 0x1f);
        if (SBORROW4(uVar6,-uVar3) == (int)(uVar6 + uVar3) < 0) goto LAB_001385ac;
      }
    }
    else if ((int)uVar6 <= (int)(0x7fffU >> (bVar5 & 0x1f))) goto LAB_001385ac;
  }
  pcVar4 = "can\'t merge dc and ac";
LAB_001384eb:
  *(char **)(in_FS_OFFSET + -8) = pcVar4;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}